

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall
icu_63::TextTrieMap::put(TextTrieMap *this,UChar *key,void *value,UErrorCode *status)

{
  UVector *this_00;
  
  this->fIsEmpty = '\0';
  this_00 = this->fLazyContents;
  if (this_00 == (UVector *)0x0) {
    this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)key);
    if (this_00 == (UVector *)0x0) {
      this->fLazyContents = (UVector *)0x0;
      *status = U_MEMORY_ALLOCATION_ERROR;
      goto LAB_0027cc85;
    }
    UVector::UVector(this_00,status);
    this->fLazyContents = this_00;
  }
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UVector::addElement(this_00,key,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      UVector::addElement(this->fLazyContents,value,status);
      return;
    }
  }
LAB_0027cc85:
  if (this->fValueDeleter != (UObjectDeleter *)0x0) {
    (*this->fValueDeleter)(key);
    return;
  }
  return;
}

Assistant:

void
TextTrieMap::put(const UChar *key, void *value, UErrorCode &status) {
    fIsEmpty = FALSE;
    if (fLazyContents == NULL) {
        fLazyContents = new UVector(status);
        if (fLazyContents == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
        }
    }
    if (U_FAILURE(status)) {
        if (fValueDeleter) {
            fValueDeleter((void*) key);
        }
        return;
    }
    U_ASSERT(fLazyContents != NULL);

    UChar *s = const_cast<UChar *>(key);
    fLazyContents->addElement(s, status);
    if (U_FAILURE(status)) {
        if (fValueDeleter) {
            fValueDeleter((void*) key);
        }
        return;
    }

    fLazyContents->addElement(value, status);
}